

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall VmaAllocator_T::ImportVulkanFunctions_Dynamic(VmaAllocator_T *this)

{
  undefined8 uVar1;
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x1658) == 0) {
    uVar1 = (**(code **)(in_RDI + 0x1648))
                      (*(undefined8 *)(in_RDI + 0x18),"vkGetPhysicalDeviceProperties");
    *(undefined8 *)(in_RDI + 0x1658) = uVar1;
  }
  if (*(long *)(in_RDI + 0x1660) == 0) {
    uVar1 = (**(code **)(in_RDI + 0x1648))
                      (*(undefined8 *)(in_RDI + 0x18),"vkGetPhysicalDeviceMemoryProperties");
    *(undefined8 *)(in_RDI + 0x1660) = uVar1;
  }
  if (*(long *)(in_RDI + 0x1668) == 0) {
    uVar1 = (**(code **)(in_RDI + 0x1650))(*(undefined8 *)(in_RDI + 0x10),"vkAllocateMemory");
    *(undefined8 *)(in_RDI + 0x1668) = uVar1;
  }
  if (*(long *)(in_RDI + 0x1670) == 0) {
    uVar1 = (**(code **)(in_RDI + 0x1650))(*(undefined8 *)(in_RDI + 0x10),"vkFreeMemory");
    *(undefined8 *)(in_RDI + 0x1670) = uVar1;
  }
  if (*(long *)(in_RDI + 0x1678) == 0) {
    uVar1 = (**(code **)(in_RDI + 0x1650))(*(undefined8 *)(in_RDI + 0x10),"vkMapMemory");
    *(undefined8 *)(in_RDI + 0x1678) = uVar1;
  }
  if (*(long *)(in_RDI + 0x1680) == 0) {
    uVar1 = (**(code **)(in_RDI + 0x1650))(*(undefined8 *)(in_RDI + 0x10),"vkUnmapMemory");
    *(undefined8 *)(in_RDI + 0x1680) = uVar1;
  }
  if (*(long *)(in_RDI + 0x1688) == 0) {
    uVar1 = (**(code **)(in_RDI + 0x1650))
                      (*(undefined8 *)(in_RDI + 0x10),"vkFlushMappedMemoryRanges");
    *(undefined8 *)(in_RDI + 0x1688) = uVar1;
  }
  if (*(long *)(in_RDI + 0x1690) == 0) {
    uVar1 = (**(code **)(in_RDI + 0x1650))
                      (*(undefined8 *)(in_RDI + 0x10),"vkInvalidateMappedMemoryRanges");
    *(undefined8 *)(in_RDI + 0x1690) = uVar1;
  }
  if (*(long *)(in_RDI + 0x1698) == 0) {
    uVar1 = (**(code **)(in_RDI + 0x1650))(*(undefined8 *)(in_RDI + 0x10),"vkBindBufferMemory");
    *(undefined8 *)(in_RDI + 0x1698) = uVar1;
  }
  if (*(long *)(in_RDI + 0x16a0) == 0) {
    uVar1 = (**(code **)(in_RDI + 0x1650))(*(undefined8 *)(in_RDI + 0x10),"vkBindImageMemory");
    *(undefined8 *)(in_RDI + 0x16a0) = uVar1;
  }
  if (*(long *)(in_RDI + 0x16a8) == 0) {
    uVar1 = (**(code **)(in_RDI + 0x1650))
                      (*(undefined8 *)(in_RDI + 0x10),"vkGetBufferMemoryRequirements");
    *(undefined8 *)(in_RDI + 0x16a8) = uVar1;
  }
  if (*(long *)(in_RDI + 0x16b0) == 0) {
    uVar1 = (**(code **)(in_RDI + 0x1650))
                      (*(undefined8 *)(in_RDI + 0x10),"vkGetImageMemoryRequirements");
    *(undefined8 *)(in_RDI + 0x16b0) = uVar1;
  }
  if (*(long *)(in_RDI + 0x16b8) == 0) {
    uVar1 = (**(code **)(in_RDI + 0x1650))(*(undefined8 *)(in_RDI + 0x10),"vkCreateBuffer");
    *(undefined8 *)(in_RDI + 0x16b8) = uVar1;
  }
  if (*(long *)(in_RDI + 0x16c0) == 0) {
    uVar1 = (**(code **)(in_RDI + 0x1650))(*(undefined8 *)(in_RDI + 0x10),"vkDestroyBuffer");
    *(undefined8 *)(in_RDI + 0x16c0) = uVar1;
  }
  if (*(long *)(in_RDI + 0x16c8) == 0) {
    uVar1 = (**(code **)(in_RDI + 0x1650))(*(undefined8 *)(in_RDI + 0x10),"vkCreateImage");
    *(undefined8 *)(in_RDI + 0x16c8) = uVar1;
  }
  if (*(long *)(in_RDI + 0x16d0) == 0) {
    uVar1 = (**(code **)(in_RDI + 0x1650))(*(undefined8 *)(in_RDI + 0x10),"vkDestroyImage");
    *(undefined8 *)(in_RDI + 0x16d0) = uVar1;
  }
  if (*(long *)(in_RDI + 0x16d8) == 0) {
    uVar1 = (**(code **)(in_RDI + 0x1650))(*(undefined8 *)(in_RDI + 0x10),"vkCmdCopyBuffer");
    *(undefined8 *)(in_RDI + 0x16d8) = uVar1;
  }
  if (0x400fff < *(uint *)(in_RDI + 4)) {
    if (*(long *)(in_RDI + 0x16e0) == 0) {
      uVar1 = (**(code **)(in_RDI + 0x1650))
                        (*(undefined8 *)(in_RDI + 0x10),"vkGetBufferMemoryRequirements2");
      *(undefined8 *)(in_RDI + 0x16e0) = uVar1;
    }
    if (*(long *)(in_RDI + 0x16e8) == 0) {
      uVar1 = (**(code **)(in_RDI + 0x1650))
                        (*(undefined8 *)(in_RDI + 0x10),"vkGetImageMemoryRequirements2");
      *(undefined8 *)(in_RDI + 0x16e8) = uVar1;
    }
    if (*(long *)(in_RDI + 0x16f0) == 0) {
      uVar1 = (**(code **)(in_RDI + 0x1650))(*(undefined8 *)(in_RDI + 0x10),"vkBindBufferMemory2");
      *(undefined8 *)(in_RDI + 0x16f0) = uVar1;
    }
    if (*(long *)(in_RDI + 0x16f8) == 0) {
      uVar1 = (**(code **)(in_RDI + 0x1650))(*(undefined8 *)(in_RDI + 0x10),"vkBindImageMemory2");
      *(undefined8 *)(in_RDI + 0x16f8) = uVar1;
    }
    if (*(long *)(in_RDI + 0x1700) == 0) {
      uVar1 = (**(code **)(in_RDI + 0x1648))
                        (*(undefined8 *)(in_RDI + 0x18),"vkGetPhysicalDeviceMemoryProperties2");
      *(undefined8 *)(in_RDI + 0x1700) = uVar1;
    }
  }
  if ((*(byte *)(in_RDI + 8) & 1) != 0) {
    if (*(long *)(in_RDI + 0x16e0) == 0) {
      uVar1 = (**(code **)(in_RDI + 0x1650))
                        (*(undefined8 *)(in_RDI + 0x10),"vkGetBufferMemoryRequirements2KHR");
      *(undefined8 *)(in_RDI + 0x16e0) = uVar1;
    }
    if (*(long *)(in_RDI + 0x16e8) == 0) {
      uVar1 = (**(code **)(in_RDI + 0x1650))
                        (*(undefined8 *)(in_RDI + 0x10),"vkGetImageMemoryRequirements2KHR");
      *(undefined8 *)(in_RDI + 0x16e8) = uVar1;
    }
  }
  if ((*(byte *)(in_RDI + 9) & 1) != 0) {
    if (*(long *)(in_RDI + 0x16f0) == 0) {
      uVar1 = (**(code **)(in_RDI + 0x1650))
                        (*(undefined8 *)(in_RDI + 0x10),"vkBindBufferMemory2KHR");
      *(undefined8 *)(in_RDI + 0x16f0) = uVar1;
    }
    if (*(long *)(in_RDI + 0x16f8) == 0) {
      uVar1 = (**(code **)(in_RDI + 0x1650))(*(undefined8 *)(in_RDI + 0x10),"vkBindImageMemory2KHR")
      ;
      *(undefined8 *)(in_RDI + 0x16f8) = uVar1;
    }
  }
  if (((*(byte *)(in_RDI + 10) & 1) != 0) && (*(long *)(in_RDI + 0x1700) == 0)) {
    uVar1 = (**(code **)(in_RDI + 0x1648))
                      (*(undefined8 *)(in_RDI + 0x18),"vkGetPhysicalDeviceMemoryProperties2KHR");
    *(undefined8 *)(in_RDI + 0x1700) = uVar1;
  }
  if (0x402fff < *(uint *)(in_RDI + 4)) {
    if (*(long *)(in_RDI + 0x1708) == 0) {
      uVar1 = (**(code **)(in_RDI + 0x1650))
                        (*(undefined8 *)(in_RDI + 0x10),"vkGetDeviceBufferMemoryRequirements");
      *(undefined8 *)(in_RDI + 0x1708) = uVar1;
    }
    if (*(long *)(in_RDI + 0x1710) == 0) {
      uVar1 = (**(code **)(in_RDI + 0x1650))
                        (*(undefined8 *)(in_RDI + 0x10),"vkGetDeviceImageMemoryRequirements");
      *(undefined8 *)(in_RDI + 0x1710) = uVar1;
    }
  }
  return;
}

Assistant:

void VmaAllocator_T::ImportVulkanFunctions_Dynamic()
{
    VMA_ASSERT(m_VulkanFunctions.vkGetInstanceProcAddr && m_VulkanFunctions.vkGetDeviceProcAddr &&
        "To use VMA_DYNAMIC_VULKAN_FUNCTIONS in new versions of VMA you now have to pass "
        "VmaVulkanFunctions::vkGetInstanceProcAddr and vkGetDeviceProcAddr as VmaAllocatorCreateInfo::pVulkanFunctions. "
        "Other members can be null.");

#define VMA_FETCH_INSTANCE_FUNC(memberName, functionPointerType, functionNameString) \
    if(m_VulkanFunctions.memberName == VMA_NULL) \
        m_VulkanFunctions.memberName = \
            (functionPointerType)m_VulkanFunctions.vkGetInstanceProcAddr(m_hInstance, functionNameString);
#define VMA_FETCH_DEVICE_FUNC(memberName, functionPointerType, functionNameString) \
    if(m_VulkanFunctions.memberName == VMA_NULL) \
        m_VulkanFunctions.memberName = \
            (functionPointerType)m_VulkanFunctions.vkGetDeviceProcAddr(m_hDevice, functionNameString);

    VMA_FETCH_INSTANCE_FUNC(vkGetPhysicalDeviceProperties, PFN_vkGetPhysicalDeviceProperties, "vkGetPhysicalDeviceProperties");
    VMA_FETCH_INSTANCE_FUNC(vkGetPhysicalDeviceMemoryProperties, PFN_vkGetPhysicalDeviceMemoryProperties, "vkGetPhysicalDeviceMemoryProperties");
    VMA_FETCH_DEVICE_FUNC(vkAllocateMemory, PFN_vkAllocateMemory, "vkAllocateMemory");
    VMA_FETCH_DEVICE_FUNC(vkFreeMemory, PFN_vkFreeMemory, "vkFreeMemory");
    VMA_FETCH_DEVICE_FUNC(vkMapMemory, PFN_vkMapMemory, "vkMapMemory");
    VMA_FETCH_DEVICE_FUNC(vkUnmapMemory, PFN_vkUnmapMemory, "vkUnmapMemory");
    VMA_FETCH_DEVICE_FUNC(vkFlushMappedMemoryRanges, PFN_vkFlushMappedMemoryRanges, "vkFlushMappedMemoryRanges");
    VMA_FETCH_DEVICE_FUNC(vkInvalidateMappedMemoryRanges, PFN_vkInvalidateMappedMemoryRanges, "vkInvalidateMappedMemoryRanges");
    VMA_FETCH_DEVICE_FUNC(vkBindBufferMemory, PFN_vkBindBufferMemory, "vkBindBufferMemory");
    VMA_FETCH_DEVICE_FUNC(vkBindImageMemory, PFN_vkBindImageMemory, "vkBindImageMemory");
    VMA_FETCH_DEVICE_FUNC(vkGetBufferMemoryRequirements, PFN_vkGetBufferMemoryRequirements, "vkGetBufferMemoryRequirements");
    VMA_FETCH_DEVICE_FUNC(vkGetImageMemoryRequirements, PFN_vkGetImageMemoryRequirements, "vkGetImageMemoryRequirements");
    VMA_FETCH_DEVICE_FUNC(vkCreateBuffer, PFN_vkCreateBuffer, "vkCreateBuffer");
    VMA_FETCH_DEVICE_FUNC(vkDestroyBuffer, PFN_vkDestroyBuffer, "vkDestroyBuffer");
    VMA_FETCH_DEVICE_FUNC(vkCreateImage, PFN_vkCreateImage, "vkCreateImage");
    VMA_FETCH_DEVICE_FUNC(vkDestroyImage, PFN_vkDestroyImage, "vkDestroyImage");
    VMA_FETCH_DEVICE_FUNC(vkCmdCopyBuffer, PFN_vkCmdCopyBuffer, "vkCmdCopyBuffer");

#if VMA_VULKAN_VERSION >= 1001000
    if(m_VulkanApiVersion >= VK_MAKE_VERSION(1, 1, 0))
    {
        VMA_FETCH_DEVICE_FUNC(vkGetBufferMemoryRequirements2KHR, PFN_vkGetBufferMemoryRequirements2, "vkGetBufferMemoryRequirements2");
        VMA_FETCH_DEVICE_FUNC(vkGetImageMemoryRequirements2KHR, PFN_vkGetImageMemoryRequirements2, "vkGetImageMemoryRequirements2");
        VMA_FETCH_DEVICE_FUNC(vkBindBufferMemory2KHR, PFN_vkBindBufferMemory2, "vkBindBufferMemory2");
        VMA_FETCH_DEVICE_FUNC(vkBindImageMemory2KHR, PFN_vkBindImageMemory2, "vkBindImageMemory2");
        VMA_FETCH_INSTANCE_FUNC(vkGetPhysicalDeviceMemoryProperties2KHR, PFN_vkGetPhysicalDeviceMemoryProperties2, "vkGetPhysicalDeviceMemoryProperties2");
    }
#endif

#if VMA_DEDICATED_ALLOCATION
    if(m_UseKhrDedicatedAllocation)
    {
        VMA_FETCH_DEVICE_FUNC(vkGetBufferMemoryRequirements2KHR, PFN_vkGetBufferMemoryRequirements2KHR, "vkGetBufferMemoryRequirements2KHR");
        VMA_FETCH_DEVICE_FUNC(vkGetImageMemoryRequirements2KHR, PFN_vkGetImageMemoryRequirements2KHR, "vkGetImageMemoryRequirements2KHR");
    }
#endif

#if VMA_BIND_MEMORY2
    if(m_UseKhrBindMemory2)
    {
        VMA_FETCH_DEVICE_FUNC(vkBindBufferMemory2KHR, PFN_vkBindBufferMemory2KHR, "vkBindBufferMemory2KHR");
        VMA_FETCH_DEVICE_FUNC(vkBindImageMemory2KHR, PFN_vkBindImageMemory2KHR, "vkBindImageMemory2KHR");
    }
#endif // #if VMA_BIND_MEMORY2

#if VMA_MEMORY_BUDGET
    if(m_UseExtMemoryBudget)
    {
        VMA_FETCH_INSTANCE_FUNC(vkGetPhysicalDeviceMemoryProperties2KHR, PFN_vkGetPhysicalDeviceMemoryProperties2KHR, "vkGetPhysicalDeviceMemoryProperties2KHR");
    }
#endif // #if VMA_MEMORY_BUDGET

#if VMA_VULKAN_VERSION >= 1003000
    if(m_VulkanApiVersion >= VK_MAKE_VERSION(1, 3, 0))
    {
        VMA_FETCH_DEVICE_FUNC(vkGetDeviceBufferMemoryRequirements, PFN_vkGetDeviceBufferMemoryRequirements, "vkGetDeviceBufferMemoryRequirements");
        VMA_FETCH_DEVICE_FUNC(vkGetDeviceImageMemoryRequirements, PFN_vkGetDeviceImageMemoryRequirements, "vkGetDeviceImageMemoryRequirements");
    }
#endif

#undef VMA_FETCH_DEVICE_FUNC
#undef VMA_FETCH_INSTANCE_FUNC
}